

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O2

void __thiscall tvm::runtime::WorkspacePool::Pool::Pool(Pool *this)

{
  value_type local_28;
  
  (this->allocated_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->allocated_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->free_list_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->allocated_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->free_list_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->free_list_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.data = (void *)0x0;
  local_28.size = 0;
  std::
  vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ::push_back(&this->free_list_,&local_28);
  std::
  vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ::push_back(&this->allocated_,&local_28);
  return;
}

Assistant:

Pool() {
    // safe guard header on each list.
    Entry e;
    e.data = nullptr;
    e.size = 0;
    free_list_.push_back(e);
    allocated_.push_back(e);
  }